

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParseResult *
read_quoted(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,string *form)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  shared_ptr<ASTNode> local_90;
  undefined1 local_80 [8];
  ParseResult object;
  undefined1 local_38 [8];
  shared_ptr<ASTNode> quote;
  string *form_local;
  shared_ptr<ASTNode> *node_local;
  istream *is_local;
  
  quote.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)form;
  std::make_shared<ASTNode>();
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  _Var1 = quote.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar2->type = NAME;
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  std::__cxx11::string::operator=((string *)&peVar2->value,(string *)_Var1._M_pi);
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  peVar2->type = LIST;
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  push_back(&peVar2->list,(value_type *)local_38);
  read_object((ParseResult *)local_80,is);
  if (local_80._0_4_ == OK) {
    peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        node);
    std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
    push_back(&peVar2->list,(value_type *)&object);
    std::shared_ptr<ASTNode>::shared_ptr(&local_90,node);
    ParseResult::ParseResult(__return_storage_ptr__,&local_90);
    std::shared_ptr<ASTNode>::~shared_ptr(&local_90);
  }
  else {
    ParseResult::ParseResult(__return_storage_ptr__,(ParseResult *)local_80);
  }
  ParseResult::~ParseResult((ParseResult *)local_80);
  std::shared_ptr<ASTNode>::~shared_ptr((shared_ptr<ASTNode> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static ParseResult read_quoted(std::istream &is, const std::shared_ptr<ASTNode> &node, const std::string &form)
{
    auto quote = std::make_shared<ASTNode>();
    quote->type = ast_type_t::NAME;
    quote->value = form;
    node->type = ast_type_t::LIST;
    node->list.push_back(quote);
    auto object = read_object(is);
    if(object.result == parse_result_t::OK)
    {
        node->list.push_back(object.node);
        return node;
    }
    return object;
}